

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg.c
# Opt level: O2

keypress borg_inkey_hack(wchar_t flush_first)

{
  _Bool _Var1;
  keycode_t kVar2;
  errr eVar3;
  uint uVar4;
  uint uVar5;
  wchar_t wVar6;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  undefined8 extraout_RDX;
  keypress kVar10;
  uint8_t t_a;
  keypress key;
  wchar_t x;
  wchar_t y;
  ui_event ch_evt;
  keypress local_438;
  char acStack_429 [1033];
  
  key.mods = '\0';
  key._9_3_ = 0;
  key.type = EVT_KBRD;
  key.code = 0;
  y = L'\0';
  x = (Term->wid + -1) / (int)(uint)tile_width;
  Term_locate(&x,&y);
  Term_fresh();
  if (borg_active == false) {
    borg_note("# Removing keypress hook");
    inkey_hack = (_func_keypress_int *)0x0;
    borg_flush();
    flush(EVENT_MAP,(game_event_data *)0x0,(void *)0x0);
    if ((uint)key_mode < 2) {
      option_set("rogue_like_commands",key_mode);
    }
    key.type = EVT_KBRD;
    key.code = 0xe000;
    goto LAB_00241f5d;
  }
  if ((flush_first != L'\0') && (kVar2 = borg_inkey(false), kVar2 != 0)) {
    borg_note("# Flushing keypress buffer");
    borg_flush();
    if (0xfa < borg.time_this_panel) {
      borg_respawning = 3;
    }
  }
  borg_what_text(L'\0',L'\0',(Term->wid + -1) / (int)(uint)tile_width,&t_a,acStack_429 + 1);
  pcVar7 = borg_trim(acStack_429 + 1);
  if ((t_a == '\0') ||
     ((((*pcVar7 == ' ' && (pcVar7[1] == ' ')) && (pcVar7[2] == ' ')) && (pcVar7[3] == ' ')))) {
    if (player->is_dead != true) {
LAB_00241b52:
      if (character_dungeon == false) {
LAB_00241d78:
        if (*borg_cfg != 0) {
          borg_note("# Mid reincarnation, no map yet");
        }
        key.code = 0x9c;
        borg_respawning = borg_respawning + -1;
        if (borg_respawning < 1) {
          borg_oops("reincarnation failure");
        }
        goto LAB_00241f5d;
      }
LAB_00241b62:
      borg_parse((char *)0x0);
      borg_dont_react = false;
      kVar2 = borg_inkey(true);
      if (kVar2 == 0) {
        Term_inkey(&ch_evt,false,true);
        if (borg.trait[0x69] < 1) {
          if ((borg.in_shop & 1U) == 0) goto LAB_00241df9;
LAB_00241e24:
          if (((ch_evt.type & EVT_SELECT) != EVT_NONE) || ((ch_evt.type & EVT_MOVE) != EVT_NONE)) {
            ch_evt.type = EVT_KBRD;
          }
          if ((player->upkeep->resting != L'\0') || (wVar6 = cmd_get_nrepeats(), L'\0' < wVar6)) {
            key._0_8_ = key._0_8_ & 0xffffffff00000000;
            goto LAB_00241f5d;
          }
          borg_confirm_target = false;
          borg_rand_quick = Rand_quick;
          borg_rand_value = Rand_value;
          Rand_quick = true;
          Rand_value = borg_rand_local;
          do {
            _Var1 = borg_think();
          } while (!_Var1);
          borg_status();
          borg_rand_local = Rand_value;
          Rand_quick = borg_rand_quick;
          Rand_value = borg_rand_value;
          if ((borg_step != 0) && (borg_step = borg_step - 1, borg_step == 0)) {
            borg_cancel = true;
          }
          kVar2 = borg_inkey(true);
          if (kVar2 != 0) goto LAB_00241b83;
          pcVar7 = "normal abort";
        }
        else {
          borg.in_shop = false;
LAB_00241df9:
          if ((((ch_evt.type & EVT_KBRD) == EVT_NONE) || (ch_evt.key.code == 0)) ||
             (ch_evt.key.code == 10)) goto LAB_00241e24;
          if (ch_evt.key.code - 0x20 < 0x5f) {
            pcVar7 = format("# User key press <%lu><%c>",(ulong)ch_evt.key.code,
                            (ulong)ch_evt.key.code);
          }
          else {
            pcVar7 = format("# User key press <%lu>");
          }
          borg_note(pcVar7);
          pcVar7 = format("# Key type was <%d><%c>",(ulong)ch_evt.type);
          borg_note(pcVar7);
          pcVar7 = "user abort";
        }
        borg_oops(pcVar7);
        key.code = 0xe000;
      }
      else {
LAB_00241b83:
        key.code = kVar2;
      }
      goto LAB_00241f5d;
    }
  }
  else {
    _Var1 = prefix(pcVar7,"Type");
    if (!_Var1) {
      if (((inkey_flag == false) && (*pcVar7 != '\0')) &&
         (_Var1 = borg_react_prompted(pcVar7,&key,x,y), _Var1)) goto LAB_00241f5d;
      if (player->is_dead != false) goto LAB_00241bce;
      if (((((L'\x06' < x && y == L'\0') & ~inkey_flag) == 1) &&
          (eVar3 = borg_what_text(x + L'\xfffffff9',L'\0',L'\a',&t_a,acStack_429 + 1), eVar3 == 0))
         && (_Var1 = suffix(acStack_429 + 1," -more-"), _Var1)) {
        if (*borg_cfg != 0) {
          borg_note("# message with -more-");
        }
        eVar3 = borg_what_text(L'\0',L'\0',x + L'\xfffffff9',&t_a,acStack_429 + 1);
        if (eVar3 == 0) {
          borg_parse(acStack_429 + 1);
        }
        if (*borg_cfg != 0) {
          borg_note("clearing -more-");
        }
      }
      else {
        if (character_dungeon == false) goto LAB_00241d78;
        if (inkey_flag != true) goto LAB_00241b62;
        if (*borg_cfg != 0) {
          borg_note("# parse normal message");
        }
        eVar3 = borg_what_text(L'\0',L'\0',(Term->wid + -1) / (int)(uint)tile_width,&t_a,
                               acStack_429 + 1);
        if (eVar3 == 0) {
          uVar8 = strlen(acStack_429 + 1);
          uVar4 = (uint)uVar8;
          while ((uVar5 = (uint)uVar8, uVar9 = (int)uVar4 >> 0x1f & uVar4, 0 < (int)uVar5 &&
                 (uVar9 = uVar5, acStack_429[uVar8 & 0xffffffff] == ' '))) {
            uVar8 = (ulong)(uVar5 - 1);
          }
          acStack_429[(long)(int)uVar9 + 1] = '\0';
          borg_parse(acStack_429 + 1);
        }
      }
      key.code = 0x20;
      goto LAB_00241f5d;
    }
    if (player->is_dead == false) goto LAB_00241b52;
  }
LAB_00241bce:
  if ((borg_cfg[0x1d] <= borg.trait[0x23]) ||
     (pcVar7 = strstr(player->died_from,"starvation"), pcVar7 != (char *)0x0)) {
    borg_write_map(false);
  }
  borg_log_death();
  borg_log_death_data();
  borg_flush();
  borg_parse((char *)0x0);
  borg_clear_reactions();
  borg_oops("player died");
  key.code = 3;
LAB_00241f5d:
  local_438.type = key.type;
  local_438.code = key.code;
  local_438.mods = key.mods;
  save_keypress_history(&local_438);
  kVar10._8_4_ = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),local_438.mods);
  kVar10.type = local_438.type;
  kVar10.code = local_438.code;
  return kVar10;
}

Assistant:

static struct keypress borg_inkey_hack(int flush_first)
{
    struct keypress k = internal_borg_inkey(flush_first);

    save_keypress_history(&k);

    return k;
}